

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::AltNode::AnnotatePass1
          (AltNode *this,Compiler *compiler,bool parentNotInLoop,bool parentAtLeastOnce,
          bool parentNotSpeculative,bool parentNotNegated)

{
  CountDomain *this_00;
  uint16 *puVar1;
  undefined1 *puVar2;
  uint uVar3;
  int iVar4;
  CharSet<char16_t> *this_01;
  Node *pNVar5;
  undefined7 in_register_00000009;
  uint uVar6;
  undefined7 in_register_00000011;
  CountDomain *other;
  uint uVar7;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  ulong uVar8;
  AltNode *curr;
  AltNode *pAVar9;
  CountDomain CVar10;
  bool bVar11;
  
  uVar7 = (uint)CONCAT71(in_register_00000081,parentNotSpeculative);
  uVar6 = (uint)CONCAT71(in_register_00000011,parentNotInLoop);
  iVar4 = 0;
  ThreadContext::ProbeStackNoDispose
            (compiler->scriptContext->threadContext,0x6000,compiler->scriptContext,(PVOID)0x0);
  (this->super_Node).features = 0x80;
  *(uint *)&(this->super_Node).field_0xc =
       (int)CONCAT71(in_register_00000089,parentNotNegated) << 0xd |
       uVar7 << 0xc | (int)CONCAT71(in_register_00000009,parentAtLeastOnce) << 0xb | uVar6 << 10 |
       *(uint *)&(this->super_Node).field_0xc & 0xffffc3ff;
  this_01 = (CharSet<char16_t> *)new<Memory::ArenaAllocator>(0x28,compiler->ctAllocator,0x35916e);
  CharSet<char16_t>::CharSet(this_01);
  (this->super_Node).firstSet = this_01;
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xffffffcc | 0x31;
  this_00 = &(this->super_Node).thisConsumes;
  uVar8 = 0xffffffffffffffff;
  CVar10.lower = 0;
  CVar10.upper = 0;
  for (pAVar9 = this; pAVar9 != (AltNode *)0x0; pAVar9 = pAVar9->tail) {
    (*pAVar9->head->_vptr_Node[7])
              (pAVar9->head,compiler,(ulong)(uVar6 & 0xff),0,(ulong)(uVar7 & 0xff),
               (ulong)(*(uint *)&(this->super_Node).field_0xc >> 0xd & 1));
    pNVar5 = pAVar9->head;
    puVar1 = &(this->super_Node).features;
    *puVar1 = *puVar1 | pNVar5->features;
    uVar3 = *(uint *)&pNVar5->field_0xc;
    if ((uVar3 & 0x10) == 0) {
      puVar2 = &(this->super_Node).field_0xc;
      *puVar2 = *puVar2 & 0xef;
      uVar3 = *(uint *)&pAVar9->head->field_0xc;
    }
    if ((uVar3 & 0x20) == 0) {
      puVar2 = &(this->super_Node).field_0xc;
      *puVar2 = *puVar2 & 0xdf;
    }
    other = &pAVar9->head->thisConsumes;
    bVar11 = iVar4 == 0;
    iVar4 = iVar4 + -1;
    if (bVar11) {
      CVar10 = *other;
      *this_00 = CVar10;
      pNVar5 = pAVar9->head;
    }
    else {
      CountDomain::Lub(this_00,other);
      pNVar5 = pAVar9->head;
      uVar3 = (pNVar5->thisConsumes).upper;
      if ((uVar3 == 0xffffffff) || (CVar10.lower <= uVar3)) {
        puVar2 = &(this->super_Node).field_0xc;
        *puVar2 = *puVar2 & 0xef;
        pNVar5 = pAVar9->head;
      }
      if (((uint)uVar8 == 0xffffffff) || ((pNVar5->thisConsumes).lower <= (uint)uVar8)) {
        puVar2 = &(this->super_Node).field_0xc;
        *puVar2 = *puVar2 & 0xdf;
        pNVar5 = pAVar9->head;
      }
      CVar10 = pNVar5->thisConsumes;
    }
    CharSet<char16_t>::UnionInPlace
              ((this->super_Node).firstSet,compiler->ctAllocator,pNVar5->firstSet);
    uVar3 = *(uint *)&pAVar9->head->field_0xc;
    if ((((uVar3 & 2) == 0 & (byte)uVar3) == 0) &&
       (puVar2 = &(this->super_Node).field_0xc, *puVar2 = *puVar2 & 0xfe,
       (pAVar9->head->field_0xc & 2) != 0)) {
      puVar2 = &(this->super_Node).field_0xc;
      *puVar2 = *puVar2 | 2;
    }
    uVar8 = (ulong)CVar10 >> 0x20;
  }
  return;
}

Assistant:

void AltNode::AnnotatePass1(Compiler& compiler, bool parentNotInLoop, bool parentAtLeastOnce, bool parentNotSpeculative, bool parentNotNegated)
    {
        PROBE_STACK_NO_DISPOSE(compiler.scriptContext, Js::Constants::MinStackRegex);

        features = HasAlt;
        isNotInLoop = parentNotInLoop;
        isAtLeastOnce = parentAtLeastOnce;
        isNotSpeculative = parentNotSpeculative;
        isNotNegated = parentNotNegated;

        // Overall alternative:
        //  - is irrefutable if at least one item is irrefutable
        //  - will not progress(regress) if each item will not progress(regress) and has strictly decreasing(increasing) consumes

        firstSet = Anew(compiler.ctAllocator, UnicodeCharSet);
        isThisIrrefutable = false;
        isThisWillNotProgress = true;
        isThisWillNotRegress = true;
        isFirstExact = true;
        CountDomain prevConsumes;
        int item = 0;
        for (AltNode *curr = this; curr != 0; curr = curr->tail, item++)
        {
            curr->head->AnnotatePass1(compiler, parentNotInLoop, false, parentNotSpeculative, isNotNegated);
            features |= curr->head->features;
            if (!curr->head->isThisWillNotProgress)
                isThisWillNotProgress = false;
            if (!curr->head->isThisWillNotRegress)
                isThisWillNotRegress = false;
            if (item == 0)
                prevConsumes = thisConsumes = curr->head->thisConsumes;
            else
            {
                thisConsumes.Lub(curr->head->thisConsumes);
                if (!curr->head->thisConsumes.IsLessThan(prevConsumes))
                    isThisWillNotProgress = false;
                if (!curr->head->thisConsumes.IsGreaterThan(prevConsumes))
                    isThisWillNotRegress = false;
                prevConsumes = curr->head->thisConsumes;
            }
            firstSet->UnionInPlace(compiler.ctAllocator, *curr->head->firstSet);
            if (!curr->head->isFirstExact || curr->head->isThisIrrefutable)
                // If any item is irrefutable then later items may never be taken, so first set cannot be exact
                isFirstExact = false;
            if (curr->head->isThisIrrefutable)
                isThisIrrefutable = true;
        }
    }